

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut2_Test *this)

{
  char *message;
  Amount AVar1;
  allocator local_384;
  allocator local_383;
  allocator local_382;
  allocator local_381;
  AssertionResult gtest_ar;
  undefined1 local_358 [32];
  string local_338;
  string local_318;
  undefined1 local_2f8 [32];
  Amount local_2d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  string local_2b0;
  Privkey local_290;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_270;
  Address local_258;
  ConfidentialTransactionContext txc;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)local_358);
  cfd::core::Txid::Txid((Txid *)&local_258,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&txc.super_ConfidentialTransaction,(Txid *)&local_258,0,0xfffffffd,
             (Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)&local_258);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)local_358,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",(allocator *)&local_290);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&local_258,(string *)local_358,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_318);
  AVar1 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_2f8._0_8_ = AVar1.amount_;
  local_2f8[8] = AVar1.ignore_check_;
  std::__cxx11::string::string
            ((string *)&local_338,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,(allocator *)&local_2b0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar,&local_338);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,&local_258,(Amount *)local_2f8,(ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_338);
  cfd::core::Address::~Address(&local_258);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_318);
  std::__cxx11::string::~string((string *)local_358);
  AVar1 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_2d8.amount_ = AVar1.amount_;
  local_2d8.ignore_check_ = AVar1.ignore_check_;
  std::__cxx11::string::string
            ((string *)local_358,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_381);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_358);
  std::__cxx11::string::string
            ((string *)&local_318,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_382);
  cfd::core::BlockHash::BlockHash((BlockHash *)&local_338,&local_318);
  std::__cxx11::string::string((string *)local_2f8,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_383)
  ;
  cfd::core::Address::Address(&local_258,(string *)local_2f8);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_270);
  cfd::core::Privkey::Privkey(&local_290);
  message = "";
  std::__cxx11::string::string((string *)&local_2b0,"",&local_384);
  cfd::core::ByteData::ByteData((ByteData *)&local_2c8);
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            (&txc,&local_2d8,(ConfidentialAssetId *)&gtest_ar,(BlockHash *)&local_338,&local_258,
             kMainnet,(Pubkey *)&local_270,&local_290,&local_2b0,0,(ByteData *)&local_2c8,kLiquidV1,
             (Address *)0x0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_270);
  cfd::core::Address::~Address(&local_258);
  std::__cxx11::string::~string((string *)local_2f8);
  cfd::core::BlockHash::~BlockHash((BlockHash *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_358);
  AVar1 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_358._0_8_ = AVar1.amount_;
  local_358[8] = AVar1.ignore_check_;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&local_338);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_258,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&txc.super_ConfidentialTransaction,(Amount *)local_358,
             (ConfidentialAssetId *)&local_258);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_258);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_258,(AbstractTransaction *)&txc);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_258._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string((string *)&local_258);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x15b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut2)
{
    ConfidentialTransactionContext txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}